

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# d3d9.cpp
# Opt level: O3

void rw::d3d9::defaultInstanceCB(Geometry *geo,InstanceDataHeader *header,bool32 reinstance)

{
  VertexStream *pVVar1;
  short *psVar2;
  ushort *puVar3;
  byte bVar4;
  uint uVar5;
  ushort uVar6;
  uint32 uVar7;
  int iVar8;
  void *pvVar9;
  uint8 *puVar10;
  byte *pbVar11;
  char *pcVar12;
  long lVar13;
  uint32 uVar14;
  uint uVar15;
  ushort uVar16;
  uint uVar17;
  uint32 *puVar18;
  ulong uVar19;
  VertexElement dcl [12];
  ushort local_98 [2];
  byte abStack_94 [100];
  
  pVVar1 = header->vertexStream;
  uVar5 = geo->flags;
  if (reinstance == 0) {
    header->vertexStream[0].offset = 0;
    header->vertexStream[0].managed = '\x01';
    header->vertexStream[0].dynamicLock = '\0';
    _local_98 = 0x200000000;
    header->vertexStream[0].geometryFlags = 2;
    if ((uVar5 & 8) == 0) {
      uVar15 = 1;
      uVar6 = 0xc;
      uVar17 = 2;
    }
    else {
      abStack_94[4] = 0;
      abStack_94[5] = 0;
      abStack_94[6] = 0xc;
      abStack_94[7] = 0;
      abStack_94[8] = 4;
      abStack_94[9] = 0;
      abStack_94[10] = 10;
      abStack_94[0xb] = 0;
      header->vertexStream[0].geometryFlags = 10;
      uVar15 = 2;
      uVar6 = 0x10;
      uVar17 = 10;
    }
    uVar16 = (ushort)uVar17;
    iVar8 = geo->numTexCoordSets;
    if (0 < iVar8) {
      uVar19 = (ulong)uVar15;
      lVar13 = 0;
      do {
        local_98[uVar19 * 4 + lVar13 * 4] = 0;
        local_98[uVar19 * 4 + lVar13 * 4 + 1] = uVar6;
        local_98[uVar19 * 4 + lVar13 * 4 + 2] = 1;
        *(undefined1 *)(local_98 + uVar19 * 4 + lVar13 * 4 + 3) = 5;
        *(byte *)((long)local_98 + lVar13 * 8 + uVar19 * 8 + 7) = (byte)lVar13;
        uVar17 = uVar17 | 0x10 << ((byte)lVar13 & 0x1f);
        uVar16 = (ushort)uVar17;
        uVar6 = uVar6 + 8;
        lVar13 = lVar13 + 1;
      } while (iVar8 != (int)lVar13);
      uVar15 = uVar15 + (int)lVar13;
      header->vertexStream[0].geometryFlags = uVar16;
    }
    if ((uVar5 & 0x10) != 0) {
      uVar19 = (ulong)uVar15;
      local_98[uVar19 * 4] = 0;
      local_98[uVar19 * 4 + 1] = uVar6;
      (local_98 + uVar19 * 4 + 2)[0] = 2;
      (local_98 + uVar19 * 4 + 2)[1] = 3;
      uVar15 = uVar15 + 1;
      header->vertexStream[0].geometryFlags = uVar16 | 4;
      uVar6 = uVar6 + 0xc;
    }
    if ((uVar5 & 8) == 0) {
      puVar3 = local_98 + (long)(int)uVar15 * 4;
      puVar3[0] = 2;
      puVar3[1] = 0xc;
      puVar3[2] = 4;
      puVar3[3] = 10;
      uVar15 = uVar15 + 1;
    }
    if (iVar8 == 0) {
      puVar3 = local_98 + (long)(int)uVar15 * 4;
      puVar3[0] = 2;
      puVar3[1] = 0x10;
      puVar3[2] = 1;
      puVar3[3] = 5;
      uVar15 = uVar15 + 1;
    }
    puVar3 = local_98 + (long)(int)uVar15 * 4;
    puVar3[0] = 0xff;
    puVar3[1] = 0;
    puVar3[2] = 0x11;
    puVar3[3] = 0;
    header->vertexStream[0].stride = (uint)uVar6;
    uVar19 = 0;
    do {
      psVar2 = (short *)((long)local_98 + uVar19);
      uVar19 = uVar19 + 8;
    } while (*psVar2 != 0xff);
    allocLocation =
         "file: /workspace/llm4binary/github/license_c_cmakelists/aap[P]librw/src/d3d/d3d9.cpp line: 84"
    ;
    pvVar9 = (void *)(*DAT_00149858)(uVar19 & 0x7fffffff8,0x30b00);
    memcpy(pvVar9,local_98,uVar19 & 0x7fffffff8);
    header->vertexDeclaration = pvVar9;
    pvVar9 = d3d::createVertexBuffer
                       (header->vertexStream[0].stride * header->totalNumVertex,0,false);
    header->vertexStream[0].vertexBuffer = pvVar9;
  }
  else {
    uVar19 = 0;
    do {
      psVar2 = (short *)((long)header->vertexDeclaration + uVar19);
      uVar19 = uVar19 + 8;
    } while (*psVar2 != 0xff);
    memcpy(local_98,header->vertexDeclaration,uVar19 & 0x7fffffff8);
    pvVar9 = pVVar1->vertexBuffer;
  }
  puVar10 = d3d::lockVertices(pvVar9,0,0,0);
  if ((reinstance == 0) || (uVar6 = geo->lockedSinceInst, (uVar6 & 2) != 0)) {
    for (pcVar12 = (char *)((long)local_98 + 7); (pcVar12[-1] != '\0' || (*pcVar12 != '\0'));
        pcVar12 = pcVar12 + 8) {
    }
    instV3d(*(int *)(d3d::vertFormatMap + (ulong)(byte)pcVar12[-3] * 4),
            puVar10 + *(ushort *)(pcVar12 + -5),geo->morphTargets->vertices,header->totalNumVertex,
            header->vertexStream[*(ushort *)(pcVar12 + -7)].stride);
    if ((uVar5 & 8) == 0) goto LAB_001160ff;
    if (reinstance != 0) {
      uVar6 = geo->lockedSinceInst;
      goto LAB_0011606b;
    }
  }
  else {
    if ((uVar5 & 8) == 0) goto LAB_001160ff;
LAB_0011606b:
    if ((uVar6 & 8) == 0) goto LAB_001160ff;
  }
  for (pcVar12 = (char *)((long)local_98 + 7); (pcVar12[-1] != '\n' || (*pcVar12 != '\0'));
      pcVar12 = pcVar12 + 8) {
  }
  uVar14 = header->numMeshes;
  if (uVar14 != 0) {
    uVar6 = *(ushort *)(pcVar12 + -7);
    bVar4 = pcVar12[-3];
    uVar16 = *(ushort *)(pcVar12 + -5);
    puVar18 = &header->inst->numVertices;
    do {
      uVar7 = instColor(*(int *)(d3d::vertFormatMap + (ulong)bVar4 * 4),
                        puVar10 + (ulong)(puVar18[-8] * pVVar1[uVar6].stride) + (ulong)uVar16,
                        geo->colors + puVar18[-8],*puVar18,pVVar1[uVar6].stride);
      puVar18[-5] = uVar7;
      puVar18 = puVar18 + 0xc;
      uVar14 = uVar14 - 1;
    } while (uVar14 != 0);
  }
LAB_001160ff:
  iVar8 = geo->numTexCoordSets;
  if (0 < iVar8) {
    uVar19 = 0;
    do {
      pbVar11 = (byte *)((long)local_98 + 7);
      if ((reinstance == 0) || ((geo->lockedSinceInst >> ((byte)uVar19 & 0x1f) & 0x10) != 0)) {
        for (; (pbVar11[-1] != 5 || (uVar19 != *pbVar11)); pbVar11 = pbVar11 + 8) {
        }
        instTexCoords(*(int *)(d3d::vertFormatMap + (ulong)pbVar11[-3] * 4),
                      puVar10 + *(ushort *)(pbVar11 + -5),geo->texCoords[uVar19],
                      header->totalNumVertex,header->vertexStream[*(ushort *)(pbVar11 + -7)].stride)
        ;
        iVar8 = geo->numTexCoordSets;
      }
      uVar19 = uVar19 + 1;
    } while ((long)uVar19 < (long)iVar8);
  }
  if (((uVar5 & 0x10) != 0) && ((reinstance == 0 || ((geo->lockedSinceInst & 4) != 0)))) {
    for (pcVar12 = (char *)((long)local_98 + 7); (pcVar12[-1] != '\x03' || (*pcVar12 != '\0'));
        pcVar12 = pcVar12 + 8) {
    }
    instV3d(*(int *)(d3d::vertFormatMap + (ulong)(byte)pcVar12[-3] * 4),
            puVar10 + *(ushort *)(pcVar12 + -5),geo->morphTargets->normals,header->totalNumVertex,
            header->vertexStream[*(ushort *)(pcVar12 + -7)].stride);
  }
  d3d::unlockVertices(pVVar1->vertexBuffer);
  return;
}

Assistant:

void
defaultInstanceCB(Geometry *geo, InstanceDataHeader *header, bool32 reinstance)
{
	int i = 0;
	VertexElement dcl[NUMDECLELT];
	VertexStream *s = &header->vertexStream[0];

	bool isPrelit = (geo->flags & Geometry::PRELIT) != 0;
	bool hasNormals = (geo->flags & Geometry::NORMALS) != 0;

	// TODO: support both vertex buffers

	if(!reinstance){
		// Create declarations and buffers only the first time

		assert(s->vertexBuffer == nil);
		s->offset = 0;
		s->managed = 1;
		s->geometryFlags = 0;
		s->dynamicLock = 0;

		dcl[i].stream = 0;
		dcl[i].offset = 0;
		dcl[i].type = D3DDECLTYPE_FLOAT3;
		dcl[i].method = D3DDECLMETHOD_DEFAULT;
		dcl[i].usage = D3DDECLUSAGE_POSITION;
		dcl[i].usageIndex = 0;
		i++;
		uint16 stride = 12;
		s->geometryFlags |= 0x2;

		if(isPrelit){
			dcl[i].stream = 0;
			dcl[i].offset = stride;
			dcl[i].type = D3DDECLTYPE_D3DCOLOR;
			dcl[i].method = D3DDECLMETHOD_DEFAULT;
			dcl[i].usage = D3DDECLUSAGE_COLOR;
			dcl[i].usageIndex = 0;
			i++;
			s->geometryFlags |= 0x8;
			stride += 4;
		}

		for(int32 n = 0; n < geo->numTexCoordSets; n++){
			dcl[i].stream = 0;
			dcl[i].offset = stride;
			dcl[i].type = D3DDECLTYPE_FLOAT2;
			dcl[i].method = D3DDECLMETHOD_DEFAULT;
			dcl[i].usage = D3DDECLUSAGE_TEXCOORD;
			dcl[i].usageIndex = (uint8)n;
			i++;
			s->geometryFlags |= 0x10 << n;
			stride += 8;
		}

		if(hasNormals){
			dcl[i].stream = 0;
			dcl[i].offset = stride;
			dcl[i].type = D3DDECLTYPE_FLOAT3;
			dcl[i].method = D3DDECLMETHOD_DEFAULT;
			dcl[i].usage = D3DDECLUSAGE_NORMAL;
			dcl[i].usageIndex = 0;
			i++;
			s->geometryFlags |= 0x4;
			stride += 12;
		}

		// We expect some attributes to always be there, use the constant buffer as fallback
		if(!isPrelit){
			dcl[i].stream = 2;
			dcl[i].offset = offsetof(VertexConstantData, color);
			dcl[i].type = D3DDECLTYPE_D3DCOLOR;
			dcl[i].method = D3DDECLMETHOD_DEFAULT;
			dcl[i].usage = D3DDECLUSAGE_COLOR;
			dcl[i].usageIndex = 0;
			i++;
		}
		if(geo->numTexCoordSets == 0){
			dcl[i].stream = 2;
			dcl[i].offset = offsetof(VertexConstantData, texCoors[0]);
			dcl[i].type = D3DDECLTYPE_FLOAT2;
			dcl[i].method = D3DDECLMETHOD_DEFAULT;
			dcl[i].usage = D3DDECLUSAGE_TEXCOORD;
			dcl[i].usageIndex = 0;
			i++;
		}

		dcl[i] = D3DDECL_END();
		s->stride = stride;

		assert(header->vertexDeclaration == nil);
		header->vertexDeclaration = createVertexDeclaration((VertexElement*)dcl);

		assert(s->vertexBuffer == nil);
		s->vertexBuffer = createVertexBuffer(header->totalNumVertex*s->stride, 0, false);
	}else
		getDeclaration(header->vertexDeclaration, dcl);

	uint8 *verts = lockVertices(s->vertexBuffer, 0, 0, D3DLOCK_NOSYSLOCK);

	// Instance vertices
	if(!reinstance || geo->lockedSinceInst&Geometry::LOCKVERTICES){
		for(i = 0; dcl[i].usage != D3DDECLUSAGE_POSITION || dcl[i].usageIndex != 0; i++)
			;
		instV3d(vertFormatMap[dcl[i].type], verts + dcl[i].offset,
			geo->morphTargets[0].vertices,
			header->totalNumVertex,
			header->vertexStream[dcl[i].stream].stride);
	}

	// Instance prelight colors
	if(isPrelit && (!reinstance || geo->lockedSinceInst&Geometry::LOCKPRELIGHT)){
		for(i = 0; dcl[i].usage != D3DDECLUSAGE_COLOR || dcl[i].usageIndex != 0; i++)
			;
		InstanceData *inst = header->inst;
		uint32 n = header->numMeshes;
		while(n--){
			uint32 stride = header->vertexStream[dcl[i].stream].stride;
			inst->vertexAlpha = instColor(vertFormatMap[dcl[i].type],
				verts + dcl[i].offset + stride*inst->minVert,
				geo->colors + inst->minVert,
				inst->numVertices,
				stride);
			inst++;
		}
	}

	// Instance tex coords
	for(int32 n = 0; n < geo->numTexCoordSets; n++){
		if(!reinstance || geo->lockedSinceInst&(Geometry::LOCKTEXCOORDS<<n)){
			for(i = 0; dcl[i].usage != D3DDECLUSAGE_TEXCOORD || dcl[i].usageIndex != n; i++)
				;
			instTexCoords(vertFormatMap[dcl[i].type], verts + dcl[i].offset,
				geo->texCoords[n],
				header->totalNumVertex,
				header->vertexStream[dcl[i].stream].stride);
		}
	}

	// Instance normals
	if(hasNormals && (!reinstance || geo->lockedSinceInst&Geometry::LOCKNORMALS)){
		for(i = 0; dcl[i].usage != D3DDECLUSAGE_NORMAL || dcl[i].usageIndex != 0; i++)
			;
		instV3d(vertFormatMap[dcl[i].type], verts + dcl[i].offset,
			geo->morphTargets[0].normals,
			header->totalNumVertex,
			header->vertexStream[dcl[i].stream].stride);
	}
	unlockVertices(s->vertexBuffer);
}